

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  char *__s;
  string message;
  allocator<char> local_41;
  string local_40;
  
  if (this->MessageNever == false) {
    if (copy) {
      __s = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_002dec2c;
      __s = "Up-to-date: ";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    std::__cxx11::string::append((string *)&local_40);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_40,-1.0);
    std::__cxx11::string::~string((string *)&local_40);
  }
LAB_002dec2c:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message = (copy ? "Installing: " : "Up-to-date: ");
    message += toFile;
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}